

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

Symbol * __thiscall
anon_unknown.dwarf_5dbbc1::InstanceBuilder::create
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  InstanceNameSyntax *pIVar1;
  DimIterator it;
  ASTContext *this_00;
  HierarchyOverrideNode *in_RAX;
  Symbol *pSVar2;
  SourceRange sourceRange;
  
  createImplicitNets(syntax,this->context,this->netType,
                     (bitmask<slang::ast::InstanceFlags>)
                     (underlying_type)*(undefined4 *)&this->flags,&this->implicitNetNames,
                     this->implicitNets);
  (this->path).super_SmallVectorBase<unsigned_int>.len = 0;
  pIVar1 = syntax->decl;
  if (pIVar1 != (InstanceNameSyntax *)0x0) {
    if (this->parentOverrideNode == (HierarchyOverrideNode *)0x0) {
      in_RAX = (HierarchyOverrideNode *)0x0;
    }
    else {
      _GLOBAL__N_1::InstanceBuilder::create();
    }
    it._M_current =
         (pIVar1->dimensions).
         super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
    pSVar2 = recurse(this,syntax,in_RAX,it,
                     (DimIterator)
                     (it._M_current +
                     (pIVar1->dimensions).
                     super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value));
    return pSVar2;
  }
  this_00 = this->context;
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
  slang::ast::ASTContext::addDiag(this_00,(DiagCode)0x4e0006,sourceRange);
  pSVar2 = createInstance(this,syntax,(HierarchyOverrideNode *)0x0);
  return pSVar2;
}

Assistant:

Symbol* create(const HierarchicalInstanceSyntax& syntax) {
        createImplicitNets(syntax, context, netType, flags, implicitNetNames, implicitNets);

        path.clear();

        if (!syntax.decl) {
            context.addDiag(diag::InstanceNameRequired, syntax.sourceRange());
            return createInstance(syntax, nullptr);
        }

        const HierarchyOverrideNode* overrideNode = nullptr;
        if (parentOverrideNode) {
            if (auto sit = parentOverrideNode->childNodes.find(overrideSyntax ? *overrideSyntax
                                                                              : syntax);
                sit != parentOverrideNode->childNodes.end()) {
                overrideNode = &sit->second;
            }
        }

        auto dims = syntax.decl->dimensions;
        return recurse(syntax, overrideNode, dims.begin(), dims.end());
    }